

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsPipeline.cpp
# Opt level: O2

Ptr<GraphicsPipeline> __thiscall
myvk::GraphicsPipeline::Create
          (GraphicsPipeline *this,Ptr<PipelineLayout> *pipeline_layout,Ptr<RenderPass> *render_pass,
          VkGraphicsPipelineCreateInfo *create_info)

{
  element_type *peVar1;
  VkDevice pVVar2;
  PFN_vkCreateGraphicsPipelines p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  int iVar5;
  VkResult VVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr<GraphicsPipeline> PVar7;
  shared_ptr<myvk::GraphicsPipeline> ret;
  VkGraphicsPipelineCreateInfo new_info;
  
  std::make_shared<myvk::GraphicsPipeline>();
  std::__shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_PipelineBase).m_pipeline_layout_ptr.
              super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>,
             &pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_render_pass_ptr).super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>,
             &render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>);
  memcpy(&new_info,create_info,0x90);
  p_Var3 = vkCreateGraphicsPipelines;
  new_info.renderPass =
       ((render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_render_pass;
  peVar1 = (pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  new_info.layout = peVar1->m_pipeline_layout;
  iVar5 = (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  pVVar2 = *(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar5) + 0x268);
  iVar5 = (*(((pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar6 = (*p_Var3)(pVVar2,*(VkPipelineCache *)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x270),1,
                    &new_info,(VkAllocationCallbacks *)0x0,
                    &((ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_PipelineBase).m_pipeline);
  _Var4 = ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (VVar6 == VK_SUCCESS) {
    ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base._vptr_Base =
         (_func_int **)
         ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var4._M_pi;
    ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  PVar7.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar7.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<GraphicsPipeline>)
         PVar7.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<GraphicsPipeline> GraphicsPipeline::Create(const Ptr<PipelineLayout> &pipeline_layout,
                                               const Ptr<RenderPass> &render_pass,
                                               const VkGraphicsPipelineCreateInfo &create_info) {
	auto ret = std::make_shared<GraphicsPipeline>();
	ret->m_pipeline_layout_ptr = pipeline_layout;
	ret->m_render_pass_ptr = render_pass;

	VkGraphicsPipelineCreateInfo new_info = create_info;
	new_info.renderPass = render_pass->GetHandle();
	new_info.layout = pipeline_layout->GetHandle();

	if (vkCreateGraphicsPipelines(pipeline_layout->GetDevicePtr()->GetHandle(),
	                              pipeline_layout->GetDevicePtr()->GetPipelineCacheHandle(), 1, &new_info, nullptr,
	                              &ret->m_pipeline) != VK_SUCCESS)
		return nullptr;
	return ret;
}